

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_0::BgColor::Render(BgColor *this,Screen *screen)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Pixel *pPVar4;
  int local_20;
  int local_1c;
  int x;
  int y;
  Screen *screen_local;
  BgColor *this_local;
  
  for (local_1c = (this->super_NodeDecorator).super_Node.box_.y_min;
      local_1c <= (this->super_NodeDecorator).super_Node.box_.y_max; local_1c = local_1c + 1) {
    for (local_20 = (this->super_NodeDecorator).super_Node.box_.x_min;
        local_20 <= (this->super_NodeDecorator).super_Node.box_.x_max; local_20 = local_20 + 1) {
      pPVar4 = Screen::PixelAt(screen,local_20,local_1c);
      uVar1 = (this->super_NodeDecorator).super_Node.field_0x5d;
      uVar2 = (this->super_NodeDecorator).super_Node.field_0x5e;
      uVar3 = (this->super_NodeDecorator).super_Node.field_0x5f;
      (pPVar4->background_color).type_ = (this->super_NodeDecorator).super_Node.field_0x5c;
      (pPVar4->background_color).red_ = uVar1;
      (pPVar4->background_color).green_ = uVar2;
      (pPVar4->background_color).blue_ = uVar3;
    }
  }
  Node::Render((Node *)this,screen);
  return;
}

Assistant:

void Render(Screen& screen) override {
    for (int y = box_.y_min; y <= box_.y_max; ++y) {
      for (int x = box_.x_min; x <= box_.x_max; ++x) {
        screen.PixelAt(x, y).background_color = color_;
      }
    }
    NodeDecorator::Render(screen);
  }